

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O2

JL_STATUS OutputStringObject(JlDataObject *StringObject,JlBuffer *JsonBuffer,
                            JL_OUTPUT_FLAGS OutputFlags,uint32_t StackDepth)

{
  char *pcVar1;
  JL_STATUS JVar2;
  size_t sVar3;
  ulong uVar4;
  char *Utf8String;
  char *Data;
  size_t sStack_70;
  uint32_t unicodeValue;
  char string_1 [7];
  char *string;
  size_t numBytes;
  
  string = (char *)0x0;
  Data = "\'";
  if ((OutputFlags & 8) == 0) {
    Data = "\"";
  }
  JVar2 = JlGetObjectString(StringObject,&string);
  if (JVar2 != JL_STATUS_SUCCESS) {
    return JVar2;
  }
  if (string == (char *)0x0) {
    Data = "null";
    sStack_70 = 4;
  }
  else {
    JVar2 = JlBufferAdd(JsonBuffer,Data,1);
    pcVar1 = string;
    if (JVar2 != JL_STATUS_SUCCESS) {
      return JVar2;
    }
    sVar3 = strlen(string);
    uVar4 = 0;
    JVar2 = JL_STATUS_SUCCESS;
    while ((uVar4 <= sVar3 && sVar3 - uVar4 != 0 && (JVar2 == JL_STATUS_SUCCESS))) {
      unicodeValue = 0;
      Utf8String = pcVar1 + uVar4;
      JVar2 = JlUnicodeCharFromUtf8(Utf8String,sVar3 - uVar4,&unicodeValue,&numBytes);
      if (JVar2 == JL_STATUS_SUCCESS) {
        sStack_70 = numBytes;
        if (unicodeValue - 0x20 < 0x60) {
          if (unicodeValue == 0x22) {
            Utf8String = "\\\"";
            goto LAB_00119d82;
          }
          if (unicodeValue == 0x27) {
            if ((OutputFlags & 8) != 0) {
              Utf8String = "\\\'";
              goto LAB_00119d82;
            }
            Utf8String = "\'";
            sStack_70 = 1;
          }
          else if (unicodeValue == 0x5c) {
            Utf8String = "\\\\";
            goto LAB_00119d82;
          }
        }
        else if (unicodeValue < 0x80 || (OutputFlags & 1) != 0) {
          switch(unicodeValue) {
          case 8:
            Utf8String = "\\b";
            break;
          case 9:
            Utf8String = "\\t";
            break;
          case 10:
            Utf8String = "\\n";
            break;
          default:
            if (unicodeValue < 0xffff) {
              string_1[4] = '\0';
              string_1[5] = '\0';
              string_1[6] = '\0';
              string_1[0] = '\0';
              string_1[1] = '\0';
              string_1[2] = '\0';
              string_1[3] = '\0';
              Utf8String = string_1;
              sprintf(Utf8String,"\\u%4.4x",(ulong)unicodeValue);
              sStack_70 = 6;
            }
            else {
              string_1[0] = '\0';
              string_1[1] = '\0';
              string_1[2] = '\0';
              string_1[3] = '\0';
              string_1[4] = '\0';
              string_1[5] = '\0';
              string_1[6] = '\0';
              Utf8String = string_1;
              sprintf(Utf8String,"\\u%4.4x\\u%4.4x",(ulong)(unicodeValue - 0x10000 >> 10),
                      (ulong)(unicodeValue & 0x3ff));
              sStack_70 = 0xc;
            }
            goto LAB_00119d85;
          case 0xc:
            Utf8String = "\\f";
            break;
          case 0xd:
            Utf8String = "\\r";
          }
LAB_00119d82:
          sStack_70 = 2;
        }
LAB_00119d85:
        JVar2 = JlBufferAdd(JsonBuffer,Utf8String,sStack_70);
      }
      uVar4 = uVar4 + numBytes;
    }
    if (JVar2 != JL_STATUS_SUCCESS) {
      return JVar2;
    }
    sStack_70 = 1;
  }
  JVar2 = JlBufferAdd(JsonBuffer,Data,sStack_70);
  return JVar2;
}

Assistant:

JL_STATUS
    OutputStringObject
    (
        JlDataObject const*     StringObject,
        JlBuffer*               JsonBuffer,
        JL_OUTPUT_FLAGS         OutputFlags,
        uint32_t                StackDepth
    )
{
    JL_STATUS jlStatus;
    char const* string = NULL;
    char const* const quoteCharStr = OutputFlags & JL_OUTPUT_FLAGS_J5_SINGLE_QUOTES ? "\'" : "\"";
    bool escapeSingleQuote = (OutputFlags & JL_OUTPUT_FLAGS_J5_SINGLE_QUOTES) ? true : false;
    bool escapeNonAscii = (OutputFlags & JL_OUTPUT_FLAGS_ASCII) ? true : false;

    jlStatus = JlGetObjectString( StringObject, &string );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        if( NULL != string )
        {
            jlStatus = JlBufferAdd( JsonBuffer, quoteCharStr, 1 );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                jlStatus = OutputUtf8String( string, escapeNonAscii, escapeSingleQuote, JsonBuffer );
            }
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                jlStatus = JlBufferAdd( JsonBuffer, quoteCharStr, 1 );
            }
        }
        else
        {
            jlStatus = JlBufferAdd( JsonBuffer, "null", 4 );
        }
    }

    return jlStatus;
}